

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

UniValue * find_value(UniValue *obj,string *name)

{
  __type _Var1;
  size_type sVar2;
  const_reference __lhs;
  const_reference pvVar3;
  uint local_24;
  uint i;
  string *name_local;
  UniValue *obj_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&obj->keys);
    if (sVar2 <= local_24) {
      return &NullUniValue;
    }
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&obj->keys,(ulong)local_24);
    _Var1 = std::operator==(__lhs,name);
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  pvVar3 = std::vector<UniValue,_std::allocator<UniValue>_>::at(&obj->values,(ulong)local_24);
  return pvVar3;
}

Assistant:

const UniValue& find_value(const UniValue& obj, const std::string& name)
{
    for (unsigned int i = 0; i < obj.keys.size(); i++)
        if (obj.keys[i] == name)
            return obj.values.at(i);

    return NullUniValue;
}